

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O3

int __thiscall net_uv::KCPSocket::connect(KCPSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  sockaddr *__ptr;
  uint uVar2;
  int iVar3;
  int iVar4;
  sockaddr *psVar5;
  uv_udp_t *puVar6;
  uint64_t uVar7;
  int32_t errcode;
  uint32_t value;
  undefined4 in_register_00000034;
  char *ip;
  sockaddr_in bind_addr;
  allocator<char> local_41;
  string local_40;
  
  ip = (char *)CONCAT44(in_register_00000034,__fd);
  if (this->m_kcpState == CLOSED) {
    psVar5 = net_getsocketAddr(ip,(uint32_t)__addr,(uint32_t *)0x0);
    if (psVar5 == (sockaddr *)0x0) {
      net_uvLog(3,"[%s:%d]Address resolution failed",ip,(ulong)__addr & 0xffffffff);
      return 0;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,ip,&local_41);
    std::__cxx11::string::_M_assign((string *)&(this->super_Socket).m_ip);
    paVar1 = &local_40.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    (this->super_Socket).m_port = (uint32_t)__addr;
    __ptr = this->m_socketAddr;
    if (__ptr != psVar5) {
      if (__ptr != (sockaddr *)0x0) {
        free(__ptr);
      }
      this->m_socketAddr = psVar5;
    }
    this->m_soType = CLI_SO;
    puVar6 = this->m_udp;
    if (puVar6 == (uv_udp_t *)0x0) {
      puVar6 = (uv_udp_t *)malloc(0xd8);
      this->m_udp = puVar6;
      uv_udp_init((this->super_Socket).m_loop,puVar6);
      this->m_udp->data = this;
      uv_ip4_addr("0.0.0.0",0,(sockaddr_in *)&local_40);
      uv_udp_bind(this->m_udp,(sockaddr *)&local_40,0);
      net_adjustBuffSize((uv_handle_t *)this->m_udp,0x10000,0x10000);
      puVar6 = this->m_udp;
    }
    uVar2 = uv_udp_recv_start(puVar6,Socket::uv_on_alloc_buffer,uv_on_after_read);
    if (uVar2 == 0) {
      this->m_kcpState = SYN_SENT;
      uVar7 = uv_now((this->super_Socket).m_loop);
      this->m_stateTimeStamp = uVar7;
      iVar3 = rand();
      iVar4 = rand();
      uVar2 = iVar4 % 1000 + iVar3 % 1000 + 1000;
      this->m_randValue = uVar2;
      kcp_making_syn_abi_cxx11_(&local_40,(net_uv *)(ulong)uVar2,value);
      udpSend(this,local_40._M_dataplus._M_p,(int32_t)local_40._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != paVar1) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      startIdle(this);
      return (int)CONCAT71((int7)((ulong)this >> 8),1);
    }
    net_getUVError_abi_cxx11_(&local_40,(net_uv *)(ulong)uVar2,errcode);
    net_uvLog(3,"uv_udp_recv_start error: %s",local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return 0;
}

Assistant:

bool KCPSocket::connect(const char* ip, uint32_t port)
{
	if (m_kcpState != State::CLOSED)
	{
		return false;
	}

	struct sockaddr* addr = net_getsocketAddr(ip, port, NULL);

	if (addr == NULL)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "[%s:%d]Address resolution failed", ip, port);
		return false;
	}

	this->setIp(ip);
	this->setPort(port);
	this->setSocketAddr(addr);
	this->m_soType = KCPSOType::CLI_SO;

	if (m_udp == NULL)
	{
		m_udp = (uv_udp_t*)fc_malloc(sizeof(uv_udp_t));
		int32_t r = uv_udp_init(m_loop, m_udp);
		CHECK_UV_ASSERT(r);
		m_udp->data = this;

		struct sockaddr_in bind_addr;
		r = uv_ip4_addr("0.0.0.0", 0, &bind_addr);
		CHECK_UV_ASSERT(r);
		r = uv_udp_bind(m_udp, (const struct sockaddr *)&bind_addr, 0);
		CHECK_UV_ASSERT(r);
		//r = uv_udp_set_broadcast(m_udp, 1);
		//CHECK_UV_ASSERT(r);

		net_adjustBuffSize((uv_handle_t*)m_udp, KCP_UV_SOCKET_RECV_BUF_LEN, KCP_UV_SOCKET_SEND_BUF_LEN);
	}

	int32_t r = uv_udp_recv_start(m_udp, uv_on_alloc_buffer, uv_on_after_read);
	if (r != 0)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "uv_udp_recv_start error: %s", net_getUVError(r).c_str());
		return false;
	}

	changeState(State::SYN_SENT);
	m_randValue = std::rand() % 1000 + std::rand() % 1000 + 1000;
	this->udpSendStr(kcp_making_syn(m_randValue));

	startIdle();

	return true;
}